

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O0

void __thiscall
cmComputeLinkInformation::AddSharedLibNoSOName(cmComputeLinkInformation *this,LinkEntry *entry)

{
  pointer this_00;
  cmListFileBacktrace local_e8 [2];
  string local_c8;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_a8;
  undefined1 local_78 [8];
  LinkEntry fileEntry;
  LinkEntry *entry_local;
  cmComputeLinkInformation *this_local;
  
  fileEntry.Feature.field_2._8_8_ = entry;
  cmComputeLinkDepends::LinkEntry::LinkEntry((LinkEntry *)local_78,entry);
  cmsys::SystemTools::GetFilenameName(&local_c8,(string *)fileEntry.Feature.field_2._8_8_);
  local_e8[0].super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_e8[0].super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  cmListFileBacktrace::cmListFileBacktrace(local_e8);
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
            (&local_a8,&local_c8,local_e8);
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::operator=
            ((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
             )local_78,&local_a8);
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
            (&local_a8);
  cmListFileBacktrace::~cmListFileBacktrace(local_e8);
  std::__cxx11::string::~string((string *)&local_c8);
  AddUserItem(this,(LinkEntry *)local_78,false);
  this_00 = std::unique_ptr<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_>::
            operator->(&this->OrderLinkerSearchPath);
  cmOrderDirectories::AddLinkLibrary(this_00,(string *)fileEntry.Feature.field_2._8_8_);
  cmComputeLinkDepends::LinkEntry::~LinkEntry((LinkEntry *)local_78);
  return;
}

Assistant:

void cmComputeLinkInformation::AddSharedLibNoSOName(LinkEntry const& entry)
{
  // We have a full path to a shared library with no soname.  We need
  // to ask the linker to locate the item because otherwise the path
  // we give to it will be embedded in the target linked.  Then at
  // runtime the dynamic linker will search for the library using the
  // path instead of just the name.
  LinkEntry fileEntry{ entry };
  fileEntry.Item = cmSystemTools::GetFilenameName(entry.Item.Value);
  this->AddUserItem(fileEntry, false);

  // Make sure the link directory ordering will find the library.
  this->OrderLinkerSearchPath->AddLinkLibrary(entry.Item.Value);
}